

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O1

stCoRoutine_t *
co_create_env(stCoRoutineEnv_t *env,stCoRoutineAttr_t *attr,pfn_co_routine_t pfn,void *arg)

{
  uint uVar1;
  int iVar2;
  stCoRoutine_t *__s;
  stStackMem_t *psVar3;
  char *pcVar4;
  int iVar5;
  stShareStack_t *psVar6;
  ulong __size;
  
  if (attr == (stCoRoutineAttr_t *)0x0) {
    iVar5 = 0x20000;
    psVar6 = (stShareStack_t *)0x0;
  }
  else {
    iVar5 = attr->stack_size;
    psVar6 = attr->share_stack;
  }
  __s = (stCoRoutine_t *)malloc(0x20c8);
  memset(__s,0,0x20c8);
  __s->env = env;
  __s->pfn = pfn;
  __s->arg = arg;
  if (psVar6 == (stShareStack_t *)0x0) {
    iVar2 = 0x800000;
    if (iVar5 < 0x800000) {
      iVar2 = iVar5;
    }
    __size = 0x20000;
    if (0 < iVar5) {
      __size = (ulong)(iVar2 + 0xfffU & 0xfffff000);
    }
    psVar3 = (stStackMem_t *)malloc(0x20);
    psVar3->occupy_co = (stCoRoutine_t *)0x0;
    psVar3->stack_size = (int)__size;
    pcVar4 = (char *)malloc(__size);
    psVar3->stack_buffer = pcVar4;
    psVar3->stack_bp = pcVar4 + __size;
  }
  else {
    uVar1 = psVar6->alloc_idx;
    __size = (ulong)(uint)psVar6->stack_size;
    psVar6->alloc_idx = uVar1 + 1;
    psVar3 = psVar6->stack_array[(int)(uVar1 % (uint)psVar6->count)];
  }
  __s->stack_mem = psVar3;
  (__s->ctx).ss_sp = psVar3->stack_buffer;
  (__s->ctx).ss_size = (long)(int)__size;
  __s->cStart = '\0';
  __s->cEnd = '\0';
  __s->cIsMain = '\0';
  __s->cEnableSysHook = '\0';
  __s->cIsShareStack = psVar6 != (stShareStack_t *)0x0;
  __s->save_size = 0;
  __s->save_buffer = (char *)0x0;
  return __s;
}

Assistant:

struct stCoRoutine_t *co_create_env( stCoRoutineEnv_t * env, const stCoRoutineAttr_t* attr,
		pfn_co_routine_t pfn,void *arg )
{

	stCoRoutineAttr_t at;
	if( attr )
	{
		memcpy( &at,attr,sizeof(at) );
	}
	if( at.stack_size <= 0 )
	{
		at.stack_size = 128 * 1024;
	}
	else if( at.stack_size > 1024 * 1024 * 8 )
	{
		at.stack_size = 1024 * 1024 * 8;
	}

	if( at.stack_size & 0xFFF ) 
	{
		at.stack_size &= ~0xFFF;
		at.stack_size += 0x1000;
	}

	stCoRoutine_t *lp = (stCoRoutine_t*)malloc( sizeof(stCoRoutine_t) );
	
	memset( lp,0,(long)(sizeof(stCoRoutine_t))); 


	lp->env = env;
	lp->pfn = pfn;
	lp->arg = arg;

	stStackMem_t* stack_mem = NULL;
	if( at.share_stack )
	{
		stack_mem = co_get_stackmem( at.share_stack);
		at.stack_size = at.share_stack->stack_size;
	}
	else
	{
		stack_mem = co_alloc_stackmem(at.stack_size);
	}
	lp->stack_mem = stack_mem;

	lp->ctx.ss_sp = stack_mem->stack_buffer;
	lp->ctx.ss_size = at.stack_size;

	lp->cStart = 0;
	lp->cEnd = 0;
	lp->cIsMain = 0;
	lp->cEnableSysHook = 0;
	lp->cIsShareStack = at.share_stack != NULL;

	lp->save_size = 0;
	lp->save_buffer = NULL;

	return lp;
}